

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

string * rcg::(anonymous_namespace)::cIFGetInfo_abi_cxx11_
                   (Interface *obj,shared_ptr<const_rcg::GenTLWrapper> *gentl,
                   INTERFACE_INFO_CMD info)

{
  PIFGetInfo p_Var1;
  PTLGetInterfaceInfo p_Var2;
  void *pvVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  INTERFACE_INFO_CMD in_ECX;
  Interface *in_RSI;
  string *in_RDI;
  bool bVar7;
  size_t i;
  GC_ERROR err;
  size_t tmp_size;
  char tmp [1024];
  INFO_DATATYPE type;
  string *ret;
  Interface *in_stack_fffffffffffffb38;
  ulong local_470;
  int local_434;
  size_t local_430;
  char local_428 [1028];
  INFO_DATATYPE local_24;
  undefined1 local_1d;
  INTERFACE_INFO_CMD local_1c;
  Interface *local_10;
  
  local_1d = 0;
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  local_24 = 0;
  memset(local_428,0,0x400);
  local_430 = 0x400;
  local_434 = -0x3e9;
  pvVar3 = Interface::getHandle(local_10);
  if (pvVar3 == (void *)0x0) {
    Interface::getParent(in_stack_fffffffffffffb38);
    peVar5 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1136a8);
    pvVar3 = System::getHandle(peVar5);
    std::shared_ptr<rcg::System>::~shared_ptr((shared_ptr<rcg::System> *)0x1136c1);
    if (pvVar3 != (void *)0x0) {
      peVar4 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1136dd);
      p_Var2 = peVar4->TLGetInterfaceInfo;
      Interface::getParent(in_stack_fffffffffffffb38);
      peVar5 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11370a);
      pvVar3 = System::getHandle(peVar5);
      Interface::getID_abi_cxx11_(local_10);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_434 = (*p_Var2)(pvVar3,pcVar6,local_1c,&local_24,local_428,&local_430);
      std::shared_ptr<rcg::System>::~shared_ptr((shared_ptr<rcg::System> *)0x113777);
    }
  }
  else {
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x113616);
    p_Var1 = peVar4->IFGetInfo;
    pvVar3 = Interface::getHandle(local_10);
    local_434 = (*p_Var1)(pvVar3,local_1c,&local_24,local_428,&local_430);
  }
  if ((local_434 == 0) && (local_24 == 1)) {
    local_470 = 0;
    while( true ) {
      bVar7 = false;
      if (local_470 < local_430) {
        bVar7 = local_428[local_470] != '\0';
      }
      if (!bVar7) break;
      std::__cxx11::string::push_back((char)in_RDI);
      local_470 = local_470 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::string cIFGetInfo(const Interface *obj,
                       const std::shared_ptr<const GenTLWrapper> &gentl,
                       GenTL::INTERFACE_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (obj->getHandle() != 0)
  {
    err=gentl->IFGetInfo(obj->getHandle(), info, &type, tmp, &tmp_size);
  }
  else if (obj->getParent()->getHandle() != 0)
  {
    err=gentl->TLGetInterfaceInfo(obj->getParent()->getHandle(), obj->getID().c_str(), info,
                                  &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}